

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O0

BCReg snap_usedef(jit_State *J,uint8_t *udf,BCIns *pc,BCReg maxslot)

{
  ushort uVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint *puVar7;
  bool bVar8;
  uint local_74;
  uint local_6c;
  BCReg local_64;
  BCReg top_1;
  BCReg top;
  ptrdiff_t delta;
  BCReg minslot;
  BCOp op;
  BCIns ins;
  GCobj *o;
  BCReg s;
  BCReg maxslot_local;
  BCIns *pc_local;
  uint8_t *udf_local;
  jit_State *J_local;
  
  if (maxslot == 0) {
    return 0;
  }
  memset(udf,1,(ulong)maxslot);
  for (_op = (undefined8 *)(J->L->openupval).gcptr64;
      (_s = pc, _op != (undefined8 *)0x0 && (J->L->base <= (TValue *)_op[4]));
      _op = (undefined8 *)*_op) {
    udf[_op[4] - (long)J->L->base >> 3] = '\0';
  }
  do {
    puVar7 = _s + 1;
    uVar4 = *_s;
    uVar2 = uVar4 & 0xff;
    if ((lj_bc_mode[uVar2] >> 3 & 0xf) == 3) {
      udf[uVar4 >> 0x18] = udf[uVar4 >> 0x18] & 0xfe;
    }
    switch(lj_bc_mode[uVar2] >> 7 & 0xf) {
    case 3:
      uVar5 = uVar4 >> 0x10 & 0xff;
      udf[uVar5] = udf[uVar5] & 0xfe;
      _s = puVar7;
      break;
    case 4:
      for (o._0_4_ = uVar4 >> 0x18; (uint)o <= (uVar4 >> 0x10 & 0xff); o._0_4_ = (uint)o + 1) {
        udf[(uint)o] = udf[(uint)o] & 0xfe;
      }
      for (; _s = puVar7, (uint)o < maxslot; o._0_4_ = (uint)o + 1) {
        udf[(uint)o] = udf[(uint)o] * '\x03';
      }
      break;
    default:
      _s = puVar7;
      break;
    case 6:
      if (((uVar2 == 0x51) || (uVar2 == 0x54)) || (uVar2 == 0x57)) goto LAB_0019f92b;
      bVar8 = true;
      if (((uVar2 != 0x49) && (bVar8 = true, uVar2 != 0x4a)) && (bVar8 = true, uVar2 != 0x4b)) {
        bVar8 = uVar2 == 0x4c;
      }
      _s = puVar7;
      if (bVar8) {
        local_6c = maxslot;
        if (uVar2 != 0x49) {
          local_6c = ((uVar4 >> 8 & 0xff) + (uVar4 >> 0x10)) - 1;
        }
        for (o._0_4_ = 0; (uint)o < (uVar4 >> 8 & 0xff); o._0_4_ = (uint)o + 1) {
          udf[(uint)o] = udf[(uint)o] * '\x03';
        }
        for (; (uint)o < local_6c; o._0_4_ = (uint)o + 1) {
          udf[(uint)o] = udf[(uint)o] & 0xfe;
        }
        for (; (uint)o < maxslot; o._0_4_ = (uint)o + 1) {
          udf[(uint)o] = udf[(uint)o] * '\x03';
        }
        return 0;
      }
      break;
    case 0xc:
      return maxslot;
    case 0xd:
LAB_0019f92b:
      delta._4_4_ = uVar4 >> 8 & 0xff;
      if ((0x4c < uVar2) && (uVar2 < 0x52)) {
        delta._4_4_ = delta._4_4_ + 3;
LAB_0019f9b4:
        for (o._0_4_ = delta._4_4_; (uint)o < maxslot; o._0_4_ = (uint)o + 1) {
          udf[(uint)o] = udf[(uint)o] * '\x03';
        }
        local_64 = maxslot;
        if (delta._4_4_ < maxslot) {
          local_64 = delta._4_4_;
        }
        return local_64;
      }
      if ((0x51 < uVar2) && (uVar2 < 0x55)) {
        delta._4_4_ = ((_s[-1] >> 0x18) - 1) + delta._4_4_;
        goto LAB_0019f9b4;
      }
      if (uVar2 != 0x32) goto LAB_0019f9b4;
      lVar3 = (ulong)(uVar4 >> 0x10) - 0x8000;
      if (lVar3 < 0) {
        return maxslot;
      }
      _s = puVar7 + lVar3;
    }
    uVar1 = lj_bc_mode[uVar2] & 7;
    if (uVar1 == 1) {
      if ((uVar2 != 0xc) && (uVar2 != 0xd)) {
        uVar4 = uVar4 >> 8 & 0xff;
        udf[uVar4] = udf[uVar4] * '\x03';
      }
    }
    else if (uVar1 == 2) {
      if ((uVar2 < 0x41) || (0x46 < uVar2)) {
        if (uVar2 == 0x47) {
          return maxslot;
        }
        if (uVar2 == 0x2c) {
          for (o._0_4_ = uVar4 >> 8 & 0xff; (uint)o <= uVar4 >> 0x10; o._0_4_ = (uint)o + 1) {
            udf[(uint)o] = udf[(uint)o] * '\x03';
          }
        }
        else if (uVar2 == 0x3f) {
          for (o._0_4_ = (uVar4 >> 8 & 0xff) - 1; (uint)o < maxslot; o._0_4_ = (uint)o + 1) {
            udf[(uint)o] = udf[(uint)o] & 0xfe;
          }
        }
      }
      else {
        local_74 = maxslot;
        if (((uVar2 != 0x41) && (uVar2 != 0x43)) && ((uVar4 >> 0x10 & 0xff) != 0)) {
          local_74 = (uVar4 >> 8 & 0xff) + (uVar4 >> 0x10 & 0xff) + 1;
        }
        uVar5 = (uVar4 >> 8 & 0xff) + 1;
        udf[uVar5] = udf[uVar5] * '\x03';
        iVar6 = 0;
        if (uVar2 == 0x45 || uVar2 == 0x46) {
          iVar6 = 3;
        }
        for (o._0_4_ = (uVar4 >> 8 & 0xff) - iVar6; (uint)o < local_74; o._0_4_ = (uint)o + 1) {
          udf[(uint)o] = udf[(uint)o] & 0xfe;
        }
        for (; (uint)o < maxslot; o._0_4_ = (uint)o + 1) {
          udf[(uint)o] = udf[(uint)o] * '\x03';
        }
        if ((uVar2 == 0x44) || (uVar2 == 0x43)) {
          for (o._0_4_ = 0; (uint)o < (uVar4 >> 8 & 0xff); o._0_4_ = (uint)o + 1) {
            udf[(uint)o] = udf[(uint)o] * '\x03';
          }
          return 0;
        }
      }
    }
    else if (uVar1 == 3) {
      uVar4 = uVar4 >> 8 & 0xff;
      udf[uVar4] = udf[uVar4] & 0xfe;
    }
  } while( true );
}

Assistant:

static BCReg snap_usedef(jit_State *J, uint8_t *udf,
			 const BCIns *pc, BCReg maxslot)
{
  BCReg s;
  GCobj *o;

  if (maxslot == 0) return 0;
#ifdef LUAJIT_USE_VALGRIND
  /* Avoid errors for harmless reads beyond maxslot. */
  memset(udf, 1, SNAP_USEDEF_SLOTS);
#else
  memset(udf, 1, maxslot);
#endif

  /* Treat open upvalues as used. */
  o = gcref(J->L->openupval);
  while (o) {
    if (uvval(gco2uv(o)) < J->L->base) break;
    udf[uvval(gco2uv(o)) - J->L->base] = 0;
    o = gcref(o->gch.nextgc);
  }

#define USE_SLOT(s)		udf[(s)] &= ~1
#define DEF_SLOT(s)		udf[(s)] *= 3

  /* Scan through following bytecode and check for uses/defs. */
  lj_assertJ(pc >= proto_bc(J->pt) && pc < proto_bc(J->pt) + J->pt->sizebc,
	     "snapshot PC out of range");
  for (;;) {
    BCIns ins = *pc++;
    BCOp op = bc_op(ins);
    switch (bcmode_b(op)) {
    case BCMvar: USE_SLOT(bc_b(ins)); break;
    default: break;
    }
    switch (bcmode_c(op)) {
    case BCMvar: USE_SLOT(bc_c(ins)); break;
    case BCMrbase:
      lj_assertJ(op == BC_CAT, "unhandled op %d with RC rbase", op);
      for (s = bc_b(ins); s <= bc_c(ins); s++) USE_SLOT(s);
      for (; s < maxslot; s++) DEF_SLOT(s);
      break;
    case BCMjump:
    handle_jump: {
      BCReg minslot = bc_a(ins);
      if (op >= BC_FORI && op <= BC_JFORL) minslot += FORL_EXT;
      else if (op >= BC_ITERL && op <= BC_JITERL) minslot += bc_b(pc[-2])-1;
      else if (op == BC_UCLO) {
	ptrdiff_t delta = bc_j(ins);
	if (delta < 0) return maxslot;  /* Prevent loop. */
	pc += delta;
	break;
      }
      for (s = minslot; s < maxslot; s++) DEF_SLOT(s);
      return minslot < maxslot ? minslot : maxslot;
      }
    case BCMlit:
      if (op == BC_JFORL || op == BC_JITERL || op == BC_JLOOP) {
	goto handle_jump;
      } else if (bc_isret(op)) {
	BCReg top = op == BC_RETM ? maxslot : (bc_a(ins) + bc_d(ins)-1);
	for (s = 0; s < bc_a(ins); s++) DEF_SLOT(s);
	for (; s < top; s++) USE_SLOT(s);
	for (; s < maxslot; s++) DEF_SLOT(s);
	return 0;
      }
      break;
    case BCMfunc: return maxslot;  /* NYI: will abort, anyway. */
    default: break;
    }
    switch (bcmode_a(op)) {
    case BCMvar: USE_SLOT(bc_a(ins)); break;
    case BCMdst:
       if (!(op == BC_ISTC || op == BC_ISFC)) DEF_SLOT(bc_a(ins));
       break;
    case BCMbase:
      if (op >= BC_CALLM && op <= BC_ITERN) {
	BCReg top = (op == BC_CALLM || op == BC_CALLMT || bc_c(ins) == 0) ?
		    maxslot : (bc_a(ins) + bc_c(ins)+LJ_FR2);
	if (LJ_FR2) DEF_SLOT(bc_a(ins)+1);
	s = bc_a(ins) - ((op == BC_ITERC || op == BC_ITERN) ? 3 : 0);
	for (; s < top; s++) USE_SLOT(s);
	for (; s < maxslot; s++) DEF_SLOT(s);
	if (op == BC_CALLT || op == BC_CALLMT) {
	  for (s = 0; s < bc_a(ins); s++) DEF_SLOT(s);
	  return 0;
	}
      } else if (op == BC_VARG) {
	return maxslot;  /* NYI: punt. */
      } else if (op == BC_KNIL) {
	for (s = bc_a(ins); s <= bc_d(ins); s++) DEF_SLOT(s);
      } else if (op == BC_TSETM) {
	for (s = bc_a(ins)-1; s < maxslot; s++) USE_SLOT(s);
      }
      break;
    default: break;
    }
    lj_assertJ(pc >= proto_bc(J->pt) && pc < proto_bc(J->pt) + J->pt->sizebc,
	       "use/def analysis PC out of range");
  }

#undef USE_SLOT
#undef DEF_SLOT

  return 0;  /* unreachable */
}